

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  ImRect *pIVar1;
  int iVar2;
  ImGuiTabBar *pIVar3;
  ImGuiTabBar *pIVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = this->FreeIdx;
  if (iVar2 == (this->Data).Size) {
    iVar5 = iVar2 + 1;
    iVar6 = (this->Data).Capacity;
    if (iVar2 < iVar6) {
      pIVar4 = (this->Data).Data;
      iVar6 = iVar5;
    }
    else {
      if (iVar6 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar6 / 2 + iVar6;
      }
      if (iVar6 <= iVar5) {
        iVar6 = iVar5;
      }
      pIVar4 = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar6 * 0x60);
      pIVar3 = (this->Data).Data;
      if (pIVar3 != (ImGuiTabBar *)0x0) {
        memcpy(pIVar4,pIVar3,(long)(this->Data).Size * 0x60);
        ImGui::MemFree((this->Data).Data);
      }
      (this->Data).Data = pIVar4;
      (this->Data).Capacity = iVar6;
      iVar6 = this->FreeIdx + 1;
    }
    (this->Data).Size = iVar5;
  }
  else {
    pIVar4 = (this->Data).Data;
    iVar6 = pIVar4[iVar2].Tabs.Size;
  }
  this->FreeIdx = iVar6;
  pIVar3 = pIVar4 + iVar2;
  (pIVar3->Tabs).Size = 0;
  (pIVar3->Tabs).Capacity = 0;
  (pIVar3->Tabs).Data = (ImGuiTabItem *)0x0;
  pIVar1 = &pIVar4[iVar2].BarRect;
  (pIVar1->Min).x = 3.4028235e+38;
  (pIVar1->Min).y = 3.4028235e+38;
  (pIVar1->Max).x = -3.4028235e+38;
  (pIVar1->Max).y = -3.4028235e+38;
  pIVar3 = pIVar4 + iVar2;
  pIVar3->ID = 0;
  pIVar3->SelectedTabId = 0;
  *(undefined8 *)(&pIVar3->ID + 2) = 0;
  pIVar4[iVar2].CurrFrameVisible = -1;
  pIVar4[iVar2].PrevFrameVisible = -1;
  pIVar3 = pIVar4 + iVar2;
  pIVar3->ContentsHeight = 0.0;
  pIVar3->OffsetMax = 0.0;
  *(undefined8 *)(&pIVar3->ContentsHeight + 2) = 0;
  pIVar3 = pIVar4 + iVar2;
  pIVar3->ScrollingTarget = 0.0;
  pIVar3->Flags = 0;
  *(undefined8 *)(&pIVar3->ScrollingTarget + 2) = 0;
  pIVar4 = pIVar4 + iVar2;
  pIVar4->WantLayout = false;
  pIVar4->VisibleTabWasSubmitted = false;
  pIVar4->LastTabItemIdx = -1;
  return (this->Data).Data + iVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }